

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void percent_rankValueFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_00;
  double r;
  CallCount *p;
  sqlite3_context *in_stack_ffffffffffffffe8;
  
  pCtx_00 = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffe8,0);
  if (pCtx_00 != (sqlite3_context *)0x0) {
    pCtx_00->pOut = (Mem *)pCtx_00->pFunc;
    if ((long)pCtx_00->pMem < 2) {
      sqlite3_result_double(pCtx_00,(double)in_stack_ffffffffffffffe8);
    }
    else {
      sqlite3_result_double
                (pCtx_00,(double)(long)pCtx_00->pOut /
                         (double)(long)((long)&pCtx_00->pMem[-1].xDel + 7));
    }
  }
  return;
}

Assistant:

static void percent_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nValue = p->nStep;
    if( p->nTotal>1 ){
      double r = (double)p->nValue / (double)(p->nTotal-1);
      sqlite3_result_double(pCtx, r);
    }else{
      sqlite3_result_double(pCtx, 0.0);
    }
  }
}